

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherical_quadrature.hpp
# Opt level: O0

void IntegratorXX::
     quadrature_traits<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>,_IntegratorXX::Delley<double>_>,_void>
     ::shift_grid(point_container *points,point_type vector)

{
  double dVar1;
  value_type *pvVar2;
  reference this;
  reference pvVar3;
  value_type *p;
  size_t i;
  size_t npts;
  point_container *points_local;
  
  pvVar2 = (value_type *)
           std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::size
                     (points);
  for (p = (value_type *)0x0; p < pvVar2; p = (value_type *)((long)p->_M_elems + 1)) {
    this = std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
           operator[](points,(size_type)p);
    pvVar3 = std::array<double,_3UL>::operator[](&vector,0);
    dVar1 = *pvVar3;
    pvVar3 = std::array<double,_3UL>::operator[](this,0);
    *pvVar3 = dVar1 + *pvVar3;
    pvVar3 = std::array<double,_3UL>::operator[](&vector,1);
    dVar1 = *pvVar3;
    pvVar3 = std::array<double,_3UL>::operator[](this,1);
    *pvVar3 = dVar1 + *pvVar3;
    pvVar3 = std::array<double,_3UL>::operator[](&vector,2);
    dVar1 = *pvVar3;
    pvVar3 = std::array<double,_3UL>::operator[](this,2);
    *pvVar3 = dVar1 + *pvVar3;
  }
  return;
}

Assistant:

inline static void shift_grid( point_container& points, point_type vector ) {

    size_t npts = points.size();
    for( size_t i = 0; i < npts; ++i ) {
      auto& p = points[i];
      p[0] += vector[0];
      p[1] += vector[1];
      p[2] += vector[2];
    }

  }